

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O1

void __thiscall
cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape
          (cbtBvhTriangleMeshShape *this,cbtStridingMeshInterface *meshInterface,
          bool useQuantizedAabbCompression,bool buildBvh)

{
  undefined3 in_register_00000009;
  
  cbtTriangleMeshShape::cbtTriangleMeshShape(&this->super_cbtTriangleMeshShape,meshInterface);
  (this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
  _vptr_cbtCollisionShape = (_func_int **)&PTR__cbtBvhTriangleMeshShape_00b71598;
  this->m_bvh = (cbtOptimizedBvh *)0x0;
  this->m_triangleInfoMap = (cbtTriangleInfoMap *)0x0;
  this->m_useQuantizedAabbCompression = useQuantizedAabbCompression;
  this->m_ownsBvh = false;
  (this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.m_shapeType =
       0x19;
  if (CONCAT31(in_register_00000009,buildBvh) != 0) {
    buildOptimizedBvh(this);
  }
  return;
}

Assistant:

cbtBvhTriangleMeshShape::cbtBvhTriangleMeshShape(cbtStridingMeshInterface* meshInterface, bool useQuantizedAabbCompression, bool buildBvh)
	: cbtTriangleMeshShape(meshInterface),
	  m_bvh(0),
	  m_triangleInfoMap(0),
	  m_useQuantizedAabbCompression(useQuantizedAabbCompression),
	  m_ownsBvh(false)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	//construct bvh from meshInterface
#ifndef DISABLE_BVH

	if (buildBvh)
	{
		buildOptimizedBvh();
	}

#endif  //DISABLE_BVH
}